

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_quads.cpp
# Opt level: O0

void __thiscall CLayerQuads::BrushPlace(CLayerQuads *this,CLayer *pBrush,float wx,float wy)

{
  int iVar1;
  CQuad *__src;
  long in_RSI;
  array<CQuad,_allocator_default<CQuad>_> *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int p;
  int i;
  CLayerQuads *l;
  CQuad n;
  undefined4 in_stack_ffffffffffffff28;
  int iVar2;
  int local_c8;
  int local_c4;
  int local_a0 [38];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c4 = 0;
  while( true ) {
    iVar2 = local_c4;
    iVar1 = array<CQuad,_allocator_default<CQuad>_>::size
                      ((array<CQuad,_allocator_default<CQuad>_> *)(in_RSI + 0x30));
    if (iVar1 <= iVar2) break;
    __src = array<CQuad,_allocator_default<CQuad>_>::operator[]
                      ((array<CQuad,_allocator_default<CQuad>_> *)(in_RSI + 0x30),local_c4);
    memcpy(local_a0,__src,0x98);
    for (local_c8 = 0; local_c8 < 5; local_c8 = local_c8 + 1) {
      iVar1 = f2fx(in_XMM0_Da);
      local_a0[(long)local_c8 * 2] = iVar1 + local_a0[(long)local_c8 * 2];
      iVar1 = f2fx(in_XMM1_Da);
      local_a0[(long)local_c8 * 2 + 1] = iVar1 + local_a0[(long)local_c8 * 2 + 1];
    }
    array<CQuad,_allocator_default<CQuad>_>::add
              (in_RDI,(CQuad *)CONCAT44(iVar2,in_stack_ffffffffffffff28));
    local_c4 = local_c4 + 1;
  }
  *(undefined1 *)(*(long *)&in_RDI->list_size + 0x1248) = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLayerQuads::BrushPlace(CLayer *pBrush, float wx, float wy)
{
	CLayerQuads *l = (CLayerQuads *)pBrush;
	for(int i = 0; i < l->m_lQuads.size(); i++)
	{
		CQuad n = l->m_lQuads[i];

		for(int p = 0; p < 5; p++)
		{
			n.m_aPoints[p].x += f2fx(wx);
			n.m_aPoints[p].y += f2fx(wy);
		}

		m_lQuads.add(n);
	}
	m_pEditor->m_Map.m_Modified = true;
}